

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O2

void __thiscall m2d::savanna::ssl_reuse::interface::on_shutdown(interface *this,error_code ec)

{
  ulong_long_type uVar1;
  bool bVar2;
  error_category *peVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  error_code eVar7;
  
  peVar3 = ec.cat_;
  uVar4 = ec._0_8_;
  eVar7 = boost::asio::error::make_error_code(eof);
  uVar6 = ec.val_;
  if (uVar6 == eVar7.val_) {
    uVar1 = (eVar7.cat_)->id_;
    bVar2 = peVar3->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = eVar7.cat_ == peVar3;
    }
    if (!bVar2) goto LAB_001749a3;
LAB_001749d0:
    uVar5 = 0;
    peVar3 = boost::system::system_category();
    uVar6 = 0;
  }
  else {
LAB_001749a3:
    eVar7 = boost::asio::ssl::error::make_error_code(stream_truncated);
    if (uVar6 == eVar7.val_) {
      uVar1 = (eVar7.cat_)->id_;
      bVar2 = peVar3->id_ == uVar1;
      if (uVar1 == 0) {
        bVar2 = eVar7.cat_ == peVar3;
      }
      if (bVar2) goto LAB_001749d0;
    }
    uVar5 = uVar4 >> 0x20;
    if ((uVar5 & 1) != 0) {
      UNRECOVERED_JUMPTABLE = this->_vptr_interface[8];
      goto LAB_00174a25;
    }
  }
  uVar4 = (ulong)uVar6 | uVar4 & 0xffffff0000000000 | (uVar5 & 0xff) << 0x20;
  UNRECOVERED_JUMPTABLE = this->_vptr_interface[5];
LAB_00174a25:
  (*UNRECOVERED_JUMPTABLE)(this,uVar4,peVar3);
  return;
}

Assistant:

void on_shutdown(beast::error_code ec){
			if (ec == net::error::eof || ec == net::ssl::error::stream_truncated) {
				// Rationale:
				// http://stackoverflow.com/questions/25587403/boost-asio-ssl-async-shutdown-always-finishes-with-an-error
				ec = {};
			}
			if (ec) {
				error_callback(ec);
				return;
			}
			on_shutdown_l(ec);
		}